

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  char *pcVar1;
  size_t __n;
  long lVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  size_type sVar8;
  ulong uVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  iterator iter;
  iterator i;
  undefined1 local_f0 [32];
  const_iterator local_d0;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [32];
  const_iterator local_88;
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  const_iterator local_58;
  path local_50;
  
  uVar9 = (p->_path)._M_string_length;
  cVar10 = (char)this;
  if (uVar9 == 0) {
    sVar8 = (this->_path)._M_string_length;
    if (sVar8 == 0) {
      return this;
    }
    cVar11 = (this->_path)._M_dataplus._M_p[sVar8 - 1];
    if (cVar11 == '/') {
      return this;
    }
    if (cVar11 == ':') {
      return this;
    }
    std::__cxx11::string::push_back(cVar10);
    return this;
  }
  cVar11 = (char)p;
  if (uVar9 < 3) {
    uVar7 = 0;
LAB_001062fd:
    if ((p->_path)._M_dataplus._M_p[uVar7] != '/') {
LAB_00106368:
      bVar5 = false;
LAB_0010636b:
      if (2 < uVar9) goto LAB_00106379;
      goto LAB_00106442;
    }
LAB_00106306:
    root_name(&local_50,this);
    __n = (this->_path)._M_string_length;
    bVar12 = true;
    if (((__n == local_50._path._M_string_length) &&
        ((__n == 0 ||
         (iVar6 = bcmp((this->_path)._M_dataplus._M_p,local_50._path._M_dataplus._M_p,__n),
         iVar6 == 0)))) && (iVar6 = std::__cxx11::string::compare((char *)p), iVar6 == 0)) {
      uVar9 = (p->_path)._M_string_length;
      bVar5 = true;
      goto LAB_0010636b;
    }
LAB_0010644d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._path._M_dataplus._M_p != &local_50._path.field_2) {
      operator_delete(local_50._path._M_dataplus._M_p,
                      local_50._path.field_2._M_allocated_capacity + 1);
    }
    if (bVar12) {
LAB_00106472:
      std::__cxx11::string::_M_assign((string *)this);
      return this;
    }
  }
  else {
    pcVar1 = (p->_path)._M_dataplus._M_p;
    if (*pcVar1 == '/') {
      if (((pcVar1[1] == '/') && (pcVar1[2] != 0x2f)) &&
         (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)) {
        uVar7 = std::__cxx11::string::find(cVar11,0x2f);
        uVar9 = (p->_path)._M_string_length;
        if (uVar7 == 0xffffffffffffffff) {
          uVar7 = uVar9;
        }
        if (uVar7 < uVar9) goto LAB_001062fd;
        goto LAB_00106368;
      }
      goto LAB_00106306;
    }
    bVar5 = false;
LAB_00106379:
    pcVar1 = (p->_path)._M_dataplus._M_p;
    if (((*pcVar1 == '/') && (pcVar1[1] == '/')) &&
       ((pcVar1[2] != 0x2f && (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)))) {
      sVar8 = std::__cxx11::string::find(cVar11,0x2f);
      if (sVar8 == 0xffffffffffffffff) {
        sVar8 = (p->_path)._M_string_length;
      }
      if (sVar8 == 0) goto LAB_00106442;
      root_name((path *)local_f0,p);
      root_name((path *)local_a8,this);
      iVar6 = compare((path *)local_f0,(path *)local_a8);
      bVar12 = iVar6 != 0;
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,CONCAT44(local_a8._20_4_,local_a8._16_4_) + 1);
      }
      if ((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_) != local_f0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_),
                        CONCAT44(local_f0._20_4_,local_f0._16_4_) + 1);
      }
      if (bVar5) goto LAB_0010644d;
      if (iVar6 != 0) goto LAB_00106472;
    }
    else {
LAB_00106442:
      if (bVar5) {
        bVar12 = false;
        goto LAB_0010644d;
      }
    }
  }
  uVar9 = (p->_path)._M_string_length;
  if (uVar9 < 3) {
    uVar7 = 0;
LAB_001064d2:
    if ((uVar9 <= uVar7) || ((p->_path)._M_dataplus._M_p[uVar7] != '/')) {
LAB_0010651f:
      uVar9 = (this->_path)._M_string_length;
      if (uVar9 < 3) {
        uVar7 = 0;
LAB_0010657a:
        if ((uVar7 < uVar9) && ((this->_path)._M_dataplus._M_p[uVar7] == '/')) goto LAB_001065e6;
        if (2 < uVar9) goto LAB_0010658f;
        uVar7 = 0;
LAB_001065d7:
        if ((uVar9 <= uVar7) || ((this->_path)._M_dataplus._M_p[uVar7] != '/')) goto LAB_001065e6;
      }
      else {
        pcVar1 = (this->_path)._M_dataplus._M_p;
        if (*pcVar1 == '/') {
          if (((pcVar1[1] == '/') && (pcVar1[2] != 0x2f)) &&
             (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)) {
            uVar7 = std::__cxx11::string::find(cVar10,0x2f);
            uVar9 = (this->_path)._M_string_length;
            if (uVar7 == 0xffffffffffffffff) {
              uVar7 = uVar9;
            }
            goto LAB_0010657a;
          }
        }
        else {
LAB_0010658f:
          pcVar1 = (this->_path)._M_dataplus._M_p;
          if (*pcVar1 == '/') {
            if (((pcVar1[1] == '/') && (pcVar1[2] != 0x2f)) &&
               (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)) {
              uVar7 = std::__cxx11::string::find(cVar10,0x2f);
              uVar9 = (this->_path)._M_string_length;
              if (uVar7 == 0xffffffffffffffff) {
                uVar7 = uVar9;
              }
              goto LAB_001065d7;
            }
            goto LAB_00106625;
          }
        }
LAB_001065e6:
        bVar5 = has_relative_path(this);
        if (!bVar5) goto LAB_00106632;
        filename((path *)local_f0,this);
        lVar2 = CONCAT44(local_f0._12_4_,local_f0._8_4_);
        if ((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_) != local_f0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_),
                          CONCAT44(local_f0._20_4_,local_f0._16_4_) + 1);
        }
        if (lVar2 == 0) goto LAB_00106632;
      }
LAB_00106625:
      std::__cxx11::string::push_back(cVar10);
      goto LAB_00106632;
    }
  }
  else {
    pcVar1 = (p->_path)._M_dataplus._M_p;
    if (*pcVar1 != '/') goto LAB_0010651f;
    if (((pcVar1[1] == '/') && (pcVar1[2] != 0x2f)) && (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)
       ) {
      uVar7 = std::__cxx11::string::find(cVar11,0x2f);
      uVar9 = (p->_path)._M_string_length;
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar9;
      }
      goto LAB_001064d2;
    }
  }
  root_name((path *)local_f0,this);
  std::__cxx11::string::_M_assign((string *)this);
  if ((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_) != local_f0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_),
                    CONCAT44(local_f0._20_4_,local_f0._16_4_) + 1);
  }
LAB_00106632:
  local_a8._0_8_ = (p->_path)._M_dataplus._M_p;
  iterator::iterator((iterator *)local_f0,p,(const_iterator *)local_a8);
  if (((2 < (p->_path)._M_string_length) && (pcVar1 = (p->_path)._M_dataplus._M_p, *pcVar1 == '/'))
     && ((pcVar1[1] == '/' && ((pcVar1[2] != 0x2f && (iVar6 = isprint((int)pcVar1[2]), iVar6 != 0)))
         ))) {
    sVar8 = std::__cxx11::string::find(cVar11,0x2f);
    if (sVar8 == 0xffffffffffffffff) {
      sVar8 = (p->_path)._M_string_length;
    }
    if (sVar8 != 0) {
      iterator::operator++((iterator *)local_f0);
    }
  }
  bVar5 = true;
  while( true ) {
    local_58._M_current = (p->_path)._M_dataplus._M_p + (p->_path)._M_string_length;
    iterator::iterator((iterator *)local_a8,p,&local_58);
    cVar4._M_current = local_88._M_current;
    cVar3._M_current = local_d0._M_current;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    if (cVar3._M_current == cVar4._M_current) break;
    if ((!bVar5) &&
       ((sVar8 = (this->_path)._M_string_length, sVar8 == 0 ||
        ((this->_path)._M_dataplus._M_p[sVar8 - 1] != '/')))) {
      std::__cxx11::string::push_back(cVar10);
    }
    local_88._M_current = local_d0._M_current;
    local_a8._16_4_ = local_f0._16_4_;
    local_a8._20_4_ = local_f0._20_4_;
    local_a8._24_4_ = local_f0._24_4_;
    local_a8._28_4_ = local_f0._28_4_;
    local_a8._4_4_ = local_f0._4_4_;
    local_a8._0_4_ = local_f0._0_4_;
    local_a8._8_4_ = local_f0._8_4_;
    local_a8._12_4_ = local_f0._12_4_;
    local_80._M_p = (pointer)&local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_c8._M_p,local_c8._M_p + local_c0);
    iterator::operator++((iterator *)local_f0);
    std::__cxx11::string::_M_append((char *)this,(ulong)local_80._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_p != &local_70) {
      operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
    }
    bVar5 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p == &local_b8) {
    return this;
  }
  operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  return this;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != preferred_separator && _path[_path.length() - 1] != ':') {
            _path += preferred_separator;
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name()._path || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += preferred_separator;
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == preferred_separator)) {
            _path += preferred_separator;
        }
        first = false;
        _path += (*iter++).native();
    }
    check_long_path();
    return *this;
}